

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void __thiscall pbrt::IPCChannel::IPCChannel(IPCChannel *this,string *hostname)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->numFailures = 0;
  (this->address)._M_dataplus._M_p = (pointer)&(this->address).field_2;
  (this->address)._M_string_length = 0;
  (this->address).field_2._M_local_buf[0] = '\0';
  (this->port)._M_dataplus._M_p = (pointer)&(this->port).field_2;
  (this->port)._M_string_length = 0;
  (this->port).field_2._M_local_buf[0] = '\0';
  this->socketFd = -1;
  LOCK();
  iVar2 = numActiveChannels + 1;
  UNLOCK();
  bVar4 = numActiveChannels == 0;
  numActiveChannels = iVar2;
  if (bVar4) {
    signal(0xd,(__sighandler_t)0x1);
  }
  lVar3 = std::__cxx11::string::rfind((char)hostname,0x3a);
  if (lVar3 != -1) {
    pcVar1 = (hostname->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_50,pcVar1,pcVar1 + lVar3);
    std::__cxx11::string::operator=((string *)&this->address,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    pcVar1 = (hostname->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_50,pcVar1 + lVar3 + 1,pcVar1 + hostname->_M_string_length);
    std::__cxx11::string::operator=((string *)&this->port,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    Connect(this);
    return;
  }
  ErrorExit<std::__cxx11::string_const&>
            ("Expected \"host:port\" for display server address. Given \"%s\".",hostname);
}

Assistant:

IPCChannel::IPCChannel(const std::string &hostname) {
    if (numActiveChannels++ == 0) {
#ifdef PBRT_IS_WINDOWS
        WSADATA wsaData;
        int err = WSAStartup(MAKEWORD(2, 2), &wsaData);
        if (err != NO_ERROR)
            LOG_FATAL("Unable to initialize WinSock: %s", ErrorString(err));
#else
        // We don't care about getting a SIGPIPE if the display server goes
        // away...
        signal(SIGPIPE, SIG_IGN);
#endif
    }

    size_t split = hostname.find_last_of(':');
    if (split == std::string::npos)
        ErrorExit("Expected \"host:port\" for display server address. Given \"%s\".",
                  hostname);
    address = std::string(hostname.begin(), hostname.begin() + split);
    port = std::string(hostname.begin() + split + 1, hostname.end());

    Connect();
}